

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch_common.c
# Opt level: O0

_Bool epoxy_is_desktop_gl(void)

{
  _Bool _Var1;
  EGLenum EVar2;
  int iVar3;
  GLubyte *__s2;
  size_t __n;
  char *version;
  char *es_prefix;
  
  _Var1 = epoxy_current_context_is_egl();
  if ((_Var1) && (EVar2 = epoxy_egl_get_current_gl_context_api(), EVar2 != 0x3038)) {
    if (EVar2 == 0x30a0) {
      return false;
    }
    if (EVar2 == 0x30a2) {
      return true;
    }
  }
  if (api.begin_count == 0) {
    __s2 = (*epoxy_glGetString)(0x1f02);
    if (__s2 == (GLubyte *)0x0) {
      es_prefix._7_1_ = true;
    }
    else {
      __n = strlen("OpenGL ES");
      iVar3 = strncmp("OpenGL ES",(char *)__s2,__n);
      es_prefix._7_1_ = iVar3 != 0;
    }
  }
  else {
    es_prefix._7_1_ = true;
  }
  return es_prefix._7_1_;
}

Assistant:

EPOXY_IMPORTEXPORT bool
epoxy_is_desktop_gl(void)
{
    const char *es_prefix = "OpenGL ES";
    const char *version;

#if EPOXY_SUPPORT_EGL
    /* PowerVR's OpenGL ES implementation (and perhaps other) don't
     * comply with the standard, which states that
     * "glGetString(GL_VERSION)" should return a string starting with
     * "OpenGL ES". Therefore, to distinguish desktop OpenGL from
     * OpenGL ES, we must also check the context type through EGL (we
     * can do that as PowerVR is only usable through EGL).
     */
    if (epoxy_current_context_is_egl()) {
        switch (epoxy_egl_get_current_gl_context_api()) {
        case EGL_OPENGL_API:     return true;
        case EGL_OPENGL_ES_API:  return false;
        case EGL_NONE:
        default:  break;
        }
    }
#endif

    if (api.begin_count)
        return true;

    version = (const char *)glGetString(GL_VERSION);

    /* If we didn't get a version back, there are only two things that
     * could have happened: either malloc failure (which basically
     * doesn't exist), or we were called within a glBegin()/glEnd().
     * Assume the second, which only exists for desktop GL.
     */
    if (!version)
        return true;

    return strncmp(es_prefix, version, strlen(es_prefix));
}